

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

Vector * MulInv_QV(QMatrix *Q,Vector *V)

{
  double dVar1;
  double dVar2;
  Boolean BVar3;
  double Dim;
  size_t *psVar4;
  ElType **ppEVar5;
  Real *pRVar6;
  Real *pRVar7;
  Real *pRVar8;
  double dVar9;
  LASErrIdType LVar10;
  Vector *V_00;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  double dVar16;
  Real *pRVar17;
  size_t sVar18;
  ElType *pEVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar10 = LASResult();
  if (LVar10 != LASOK) {
    V_00 = (Vector *)0x0;
    goto LAB_0010cae7;
  }
  Dim = (double)V->Dim;
  if ((double)Q->Dim != Dim) {
    pcVar11 = Q_GetName(Q);
    pcVar14 = V_GetName(V);
    V_00 = (Vector *)0x0;
    LASError(LASDimErr,"MulInv_QV",pcVar11,pcVar14,(char *)0x0);
    goto LAB_0010cae7;
  }
  V_00 = (Vector *)malloc(0x30);
  pcVar11 = Q_GetName(Q);
  sVar12 = strlen(pcVar11);
  pcVar11 = V_GetName(V);
  sVar13 = strlen(pcVar11);
  pcVar11 = (char *)malloc(sVar12 + sVar13 + 0x14);
  pcVar14 = Q_GetName(Q);
  pcVar15 = V_GetName(V);
  if ((V_00 == (Vector *)0x0) || (pcVar11 == (char *)0x0)) {
    LASError(LASMemAllocErr,"MulInv_QV",pcVar14,pcVar15,(char *)0x0);
    if (V_00 != (Vector *)0x0) {
      free(V_00);
    }
  }
  else {
    sprintf(pcVar11,"(%s)^(-1) * (%s)",pcVar14,pcVar15);
    V_Constr(V_00,pcVar11,(size_t)Dim,Tempor,True);
    Q_SortEl(Q);
    Q_AllocInvDiagEl(Q);
    LVar10 = LASResult();
    if ((((LVar10 != LASOK) || (*Q->ElSorted == False)) || (*Q->ZeroInDiag != False)) ||
       (ABS(Q->MultiplD) < 2.2250738585072014e-307)) {
      LVar10 = LASResult();
      if ((LVar10 == LASOK) && (*Q->ElSorted == False)) {
        pcVar14 = Q_GetName(Q);
        pcVar15 = V_GetName(V);
        LASError(LASElNotSortedErr,"MulInv_QV",pcVar14,pcVar15,(char *)0x0);
      }
      LVar10 = LASResult();
      if ((LVar10 != LASOK) ||
         ((*Q->ZeroInDiag == False && (2.2250738585072014e-307 <= ABS(Q->MultiplD)))))
      goto LAB_0010cada;
      pcVar14 = Q_GetName(Q);
      pcVar15 = V_GetName(V);
      LVar10 = LASZeroInDiagErr;
    }
    else {
      psVar4 = Q->Len;
      ppEVar5 = Q->El;
      pRVar6 = Q->InvDiagEl;
      pRVar7 = V->Cmp;
      pRVar8 = V_00->Cmp;
      if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
        V_SetAllCmp(V_00,0.0);
      }
      dVar16 = Q->MultiplU;
      dVar21 = 1.0 / Q->MultiplD;
      dVar1 = Q->MultiplL;
      dVar2 = V->Multipl;
      dVar26 = ABS(dVar16);
      dVar22 = ABS(dVar1);
      dVar23 = ABS(dVar21 + -1.0);
      dVar24 = ABS(dVar2 + -1.0);
      if (((2.2250738585072014e-307 <= ABS(dVar21)) && (dVar26 < 2.2250738585072014e-307)) &&
         (dVar22 < 2.2250738585072014e-307)) {
        dVar25 = dVar2 / Q->MultiplD;
        if (2.220446049250313e-15 <= ABS(dVar25 + -1.0)) {
          if (Dim != 0.0) {
            dVar27 = 4.94065645841247e-324;
            do {
              pRVar8[(long)dVar27] = pRVar7[(long)dVar27] * dVar25 * pRVar6[(long)dVar27];
              dVar27 = (double)((long)dVar27 + 1);
            } while ((ulong)dVar27 <= (ulong)Dim);
          }
        }
        else if (Dim != 0.0) {
          dVar25 = 4.94065645841247e-324;
          do {
            pRVar8[(long)dVar25] = pRVar7[(long)dVar25] * pRVar6[(long)dVar25];
            dVar25 = (double)((long)dVar25 + 1);
          } while ((ulong)dVar25 <= (ulong)Dim);
        }
      }
      if ((dVar26 < 2.2250738585072014e-307) || (2.2250738585072014e-307 <= dVar22))
      goto LAB_0010cf37;
      BVar3 = Q->Symmetry;
      if (BVar3 == False) {
        if (Q->ElOrder == Rowws) {
          if (Dim != 0.0) goto LAB_0010cd0e;
          goto LAB_0010ce0a;
        }
LAB_0010ce38:
        if (Q->ElOrder == Clmws) {
          if (Dim != 0.0) goto LAB_0010ce4c;
        }
        else if (BVar3 != False) goto LAB_0010ce0e;
      }
      else {
        if (Dim != 0.0 && Q->ElOrder == Rowws) {
LAB_0010cd0e:
          uVar20 = -(ulong)(ABS(dVar16 + -1.0) < 2.220446049250313e-15);
          dVar25 = Dim;
          do {
            sVar18 = psVar4[(long)dVar25];
            if (sVar18 == 0) {
              dVar27 = 0.0;
            }
            else {
              pRVar17 = &ppEVar5[(long)dVar25][sVar18 - 1].Val;
              dVar27 = 0.0;
              do {
                if (((ElType *)(pRVar17 + -1))->Pos <= (ulong)dVar25) break;
                dVar27 = dVar27 - *pRVar17 * pRVar8[((ElType *)(pRVar17 + -1))->Pos];
                pRVar17 = pRVar17 + -2;
                sVar18 = sVar18 - 1;
              } while (sVar18 != 0);
            }
            dVar27 = (double)((ulong)dVar27 & uVar20 | ~uVar20 & (ulong)(dVar16 * dVar27));
            dVar27 = (double)(~-(ulong)(dVar24 < 2.220446049250313e-15) &
                              (ulong)(pRVar7[(long)dVar25] * dVar2 + dVar27) |
                             (ulong)(dVar27 + pRVar7[(long)dVar25]) &
                             -(ulong)(dVar24 < 2.220446049250313e-15));
            pRVar8[(long)dVar25] =
                 (double)(~-(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)(dVar27 * dVar21) |
                         -(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)dVar27) *
                 pRVar6[(long)dVar25];
            dVar25 = (double)((long)dVar25 + -1);
          } while (dVar25 != 0.0);
        }
LAB_0010ce0a:
        if (BVar3 == False) goto LAB_0010ce38;
LAB_0010ce0e:
        if (Dim != 0.0 && Q->ElOrder == Clmws) {
LAB_0010ce4c:
          uVar20 = -(ulong)(ABS(dVar16 + -1.0) < 2.220446049250313e-15);
          dVar25 = Dim;
          do {
            dVar27 = (double)(~uVar20 & (ulong)(dVar16 * pRVar8[(long)dVar25]) |
                             (ulong)pRVar8[(long)dVar25] & uVar20);
            dVar27 = (double)(~-(ulong)(dVar24 < 2.220446049250313e-15) &
                              (ulong)(pRVar7[(long)dVar25] * dVar2 + dVar27) |
                             (ulong)(dVar27 + pRVar7[(long)dVar25]) &
                             -(ulong)(dVar24 < 2.220446049250313e-15));
            dVar27 = (double)(~-(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)(dVar27 * dVar21) |
                             -(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)dVar27) *
                     pRVar6[(long)dVar25];
            pRVar8[(long)dVar25] = dVar27;
            sVar18 = psVar4[(long)dVar25];
            if (sVar18 != 0) {
              pEVar19 = ppEVar5[(long)dVar25];
              do {
                dVar9 = (double)pEVar19->Pos;
                if ((ulong)dVar25 <= (ulong)dVar9) break;
                pRVar8[(long)dVar9] = pRVar8[(long)dVar9] - pEVar19->Val * dVar27;
                pEVar19 = pEVar19 + 1;
                sVar18 = sVar18 - 1;
              } while (sVar18 != 0);
            }
            dVar25 = (double)((long)dVar25 + -1);
          } while (dVar25 != 0.0);
        }
      }
LAB_0010cf37:
      if (2.2250738585072014e-307 <= dVar26 || dVar22 < 2.2250738585072014e-307) goto LAB_0010d18f;
      BVar3 = Q->Symmetry;
      if (BVar3 == False) {
        if (Q->ElOrder == Rowws) {
          if (Dim != 0.0) goto LAB_0010cf7a;
          goto LAB_0010d063;
        }
LAB_0010d091:
        if (Q->ElOrder == Clmws) {
          if (Dim != 0.0) goto LAB_0010d0a5;
        }
        else if (BVar3 != False) goto LAB_0010d067;
      }
      else {
        if (Dim != 0.0 && Q->ElOrder == Clmws) {
LAB_0010cf7a:
          dVar16 = 4.94065645841247e-324;
          uVar20 = -(ulong)(ABS(dVar1 + -1.0) < 2.220446049250313e-15);
          do {
            sVar18 = psVar4[(long)dVar16];
            if (sVar18 == 0) {
              dVar25 = 0.0;
            }
            else {
              pEVar19 = ppEVar5[(long)dVar16];
              dVar25 = 0.0;
              do {
                if ((ulong)dVar16 <= pEVar19->Pos) break;
                dVar25 = dVar25 - pEVar19->Val * pRVar8[pEVar19->Pos];
                pEVar19 = pEVar19 + 1;
                sVar18 = sVar18 - 1;
              } while (sVar18 != 0);
            }
            dVar25 = (double)((ulong)dVar25 & uVar20 | ~uVar20 & (ulong)(dVar1 * dVar25));
            dVar25 = (double)(~-(ulong)(dVar24 < 2.220446049250313e-15) &
                              (ulong)(pRVar7[(long)dVar16] * dVar2 + dVar25) |
                             (ulong)(dVar25 + pRVar7[(long)dVar16]) &
                             -(ulong)(dVar24 < 2.220446049250313e-15));
            pRVar8[(long)dVar16] =
                 (double)(~-(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)(dVar25 * dVar21) |
                         -(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)dVar25) *
                 pRVar6[(long)dVar16];
            dVar16 = (double)((long)dVar16 + 1);
          } while ((ulong)dVar16 <= (ulong)Dim);
        }
LAB_0010d063:
        if (BVar3 == False) goto LAB_0010d091;
LAB_0010d067:
        if (Dim != 0.0 && Q->ElOrder == Rowws) {
LAB_0010d0a5:
          dVar16 = 4.94065645841247e-324;
          uVar20 = -(ulong)(ABS(dVar1 + -1.0) < 2.220446049250313e-15);
          do {
            dVar25 = (double)(~uVar20 & (ulong)(dVar1 * pRVar8[(long)dVar16]) |
                             (ulong)pRVar8[(long)dVar16] & uVar20);
            dVar25 = (double)(~-(ulong)(dVar24 < 2.220446049250313e-15) &
                              (ulong)(pRVar7[(long)dVar16] * dVar2 + dVar25) |
                             (ulong)(dVar25 + pRVar7[(long)dVar16]) &
                             -(ulong)(dVar24 < 2.220446049250313e-15));
            dVar25 = (double)(~-(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)(dVar25 * dVar21) |
                             -(ulong)(dVar23 < 2.220446049250313e-15) & (ulong)dVar25) *
                     pRVar6[(long)dVar16];
            pRVar8[(long)dVar16] = dVar25;
            sVar18 = psVar4[(long)dVar16];
            if (sVar18 != 0) {
              pRVar17 = &ppEVar5[(long)dVar16][sVar18 - 1].Val;
              do {
                dVar27 = (double)((ElType *)(pRVar17 + -1))->Pos;
                if ((ulong)dVar27 <= (ulong)dVar16) break;
                pRVar8[(long)dVar27] = pRVar8[(long)dVar27] - *pRVar17 * dVar25;
                pRVar17 = pRVar17 + -2;
                sVar18 = sVar18 - 1;
              } while (sVar18 != 0);
            }
            dVar16 = (double)((long)dVar16 + 1);
          } while ((ulong)dVar16 <= (ulong)Dim);
        }
      }
LAB_0010d18f:
      if ((dVar26 < 2.2250738585072014e-307) || (dVar22 < 2.2250738585072014e-307))
      goto LAB_0010cada;
      pcVar14 = Q_GetName(Q);
      pcVar15 = V_GetName(V);
      LVar10 = LASMulInvErr;
    }
    LASError(LVar10,"MulInv_QV",pcVar14,pcVar15,(char *)0x0);
  }
LAB_0010cada:
  if (pcVar11 != (char *)0x0) {
    free(pcVar11);
  }
LAB_0010cae7:
  Q_Unlock(Q);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *MulInv_QV(QMatrix *Q, Vector *V)
/* VRes = Q^(-1) * V, this operation is limited to diagonal or triangular
   matrices */
{
    Vector *VRes;

    char *VResName;
    double MultiplD, MultiplU, MultiplL, MultiplV, MultiplDV;
    double Sum, Cmp;
    size_t Dim, Row, Clm, Ind, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDIsZero, MultiplUIsZero, MultiplLIsZero;
    Boolean MultiplDIsOne, MultiplUIsOne, MultiplLIsOne, MultiplVIsOne,
        MultiplDVIsOne;
    ElType **QEl, *PtrEl;
    Real *QInvDiagEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 20)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s)^(-1) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);

                /* sort of elements and allocation of the inverse of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && *Q->ElSorted && !(*Q->ZeroInDiag)
                    && !IsZero(Q->MultiplD)) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QInvDiagEl = Q->InvDiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplD = 1.0 / Q->MultiplD;  /* attention here !!! */
                    MultiplU = Q->MultiplU;
                    MultiplL = Q->MultiplL;
                    MultiplV = V->Multipl;
                    MultiplDV = V->Multipl / Q->MultiplD;  /* attention here !!! */
                    MultiplDIsZero = IsZero(MultiplD);
                    MultiplUIsZero = IsZero(MultiplU);
                    MultiplLIsZero = IsZero(MultiplL);
                    MultiplDIsOne = IsOne(MultiplD);
                    MultiplUIsOne = IsOne(MultiplU);
                    MultiplLIsOne = IsOne(MultiplL);
                    MultiplVIsOne = IsOne(MultiplV);
                    MultiplDVIsOne = IsOne(MultiplDV);

                    /* multiplication of the vector V by the inverse matrix
                       of the diagonal of M */
                    if (!MultiplDIsZero && MultiplUIsZero && MultiplLIsZero) {
                        if (MultiplDVIsOne) {
                           for_AllCmp
                                VResCmp[Ind] = VCmp[Ind] * QInvDiagEl[Ind];
                        } else {
                           for_AllCmp
                                VResCmp[Ind] = MultiplDV * VCmp[Ind] * QInvDiagEl[Ind];
                        }
                    }

                    /* multiplication of the vector V by the inverse matrix
                       of the upper triangular part of M */
                    if (!MultiplUIsZero && MultiplLIsZero) {
                        if ((!Q->Symmetry && Q->ElOrder == Rowws)
                            || (Q->Symmetry && Q->ElOrder == Rowws)) {
                            for (Row = Dim; Row >= 1; Row--) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row] + Len - 1;
                                Sum = 0.0;
                                  for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                    ElCount--) {
                                    Sum -= (*PtrEl).Val * VResCmp[(*PtrEl).Pos];
                                    PtrEl--;
                                }
                                if (!MultiplUIsOne)
                                    Sum *= MultiplU;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Row];
                                else
                                    Sum += MultiplV * VCmp[Row];
                                if (MultiplDIsOne) {
                                    VResCmp[Row] = Sum * QInvDiagEl[Row];
                                } else {
                                    VResCmp[Row] = Sum * MultiplD * QInvDiagEl[Row];
                                }
                            }
                        }
                        if ((!Q->Symmetry && Q->ElOrder == Clmws)
                            || (Q->Symmetry && Q->ElOrder == Clmws)) {
                            for (Clm = Dim; Clm >= 1; Clm--) {
                                Sum = VResCmp[Clm];
                                if (!MultiplUIsOne)
                                    Sum *= MultiplU;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Clm];
                                else
                                    Sum += MultiplV * VCmp[Clm];
                                if (MultiplDIsOne) {
                                    Cmp = Sum * QInvDiagEl[Clm];
                                } else {
                                    Cmp = Sum * MultiplD * QInvDiagEl[Clm];
                                }
                                VResCmp[Clm] = Cmp;

                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                    ElCount--) {
                                    VResCmp[(*PtrEl).Pos] -= (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                        }
                    }

                    /* multiplication of the vector V by the inverse matrix 
                       of the lower triangular part of M */
                    if (MultiplUIsZero && !MultiplLIsZero) {
                        if ((!Q->Symmetry && Q->ElOrder == Rowws)
                            || (Q->Symmetry && Q->ElOrder == Clmws)) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                Sum = 0.0;
                                       for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                    ElCount--) {
                                    Sum -= (*PtrEl).Val * VResCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (!MultiplLIsOne)
                                    Sum *= MultiplL;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Row];
                                else
                                    Sum += MultiplV * VCmp[Row];
                                if (MultiplDIsOne) {
                                    VResCmp[Row] = Sum * QInvDiagEl[Row];
                                } else {
                                    VResCmp[Row] = Sum * MultiplD * QInvDiagEl[Row];
                                }
                            }
                        }
                        if ((!Q->Symmetry && Q->ElOrder == Clmws)
                            || (Q->Symmetry && Q->ElOrder == Rowws)) {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Sum = VResCmp[Clm];
                                if (!MultiplLIsOne)
                                    Sum *= MultiplL;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Clm];
                                else
                                    Sum += MultiplV * VCmp[Clm];
                                if (MultiplDIsOne) {
                                    Cmp = Sum * QInvDiagEl[Clm];
                                } else {
                                    Cmp = Sum * MultiplD * QInvDiagEl[Clm];
                                }
                                VResCmp[Clm] = Cmp;

                                Len = QLen[Clm];
                                PtrEl = QEl[Clm] + Len - 1;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                    ElCount--) {
                                    VResCmp[(*PtrEl).Pos] -= (*PtrEl).Val * Cmp;
                                    PtrEl--;
                                }
                            }
                        }
                    }
                    if (!MultiplUIsZero && !MultiplLIsZero) {
                        LASError(LASMulInvErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                    if (LASResult() == LASOK && (*Q->ZeroInDiag || IsZero(Q->MultiplD)))
                        LASError(LASZeroInDiagErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}